

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

void HEVCStreamReader::storeBuffer(MemoryBlock *dst,uint8_t *data,uint8_t *dataEnd)

{
  uint8_t *__dest;
  bool bVar1;
  uint8_t *local_20;
  uint8_t *dataEnd_local;
  uint8_t *data_local;
  MemoryBlock *dst_local;
  
  local_20 = dataEnd + -1;
  while( true ) {
    bVar1 = false;
    if (data < local_20) {
      bVar1 = local_20[-1] == '\0';
    }
    if (!bVar1) break;
    local_20 = local_20 + -1;
  }
  if (data < local_20) {
    MemoryBlock::resize(dst,(int)local_20 - (int)data);
    __dest = MemoryBlock::data(dst);
    memcpy(__dest,data,(long)local_20 - (long)data);
  }
  return;
}

Assistant:

void HEVCStreamReader::storeBuffer(MemoryBlock& dst, const uint8_t* data, const uint8_t* dataEnd)
{
    dataEnd--;
    while (dataEnd > data && dataEnd[-1] == 0) dataEnd--;
    if (dataEnd > data)
    {
        dst.resize(static_cast<int>(dataEnd - data));
        memcpy(dst.data(), data, dataEnd - data);
    }
}